

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::parseObject(Parser *this)

{
  string_view key_00;
  bool bVar1;
  uint8_t *start;
  undefined8 uVar2;
  char *msg;
  int iVar3;
  Parser *in_RDI;
  uint8_t *translated;
  Slice key;
  ValueLength lastPos;
  int i;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  Builder *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  ExceptionType EVar4;
  Builder *in_stack_ffffffffffffffa0;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this_00;
  size_t in_stack_ffffffffffffffb0;
  Slice in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  Slice local_20;
  ValueLength local_18;
  int local_c;
  
  Builder::addObject(in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
  increaseNesting((Parser *)in_stack_ffffffffffffff90);
  iVar3 = 0x13307b;
  local_c = skipWhiteSpace((Parser *)in_stack_ffffffffffffffc8._M_len,
                           (char *)in_stack_ffffffffffffffc0._start);
  if (local_c == 0x7d) {
    consume(in_RDI);
    if ((in_RDI->_nesting != 0) || ((in_RDI->options->keepTopLevelOpen & 1U) == 0)) {
      decreaseNesting(in_RDI);
      Builder::close(in_RDI->_builderPtr,iVar3);
    }
  }
  else {
    while( true ) {
      EVar4 = (ExceptionType)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (local_c != 0x22) {
        uVar2 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_ffffffffffffffa0,EVar4,(char *)in_stack_ffffffffffffff90);
        __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
      }
      in_RDI->_pos = in_RDI->_pos + 1;
      Builder::reportAdd(in_stack_ffffffffffffffa0);
      local_18 = in_RDI->_builderPtr->_pos;
      parseString((Parser *)key._start);
      if (in_RDI->options->attributeTranslator != (AttributeTranslator *)0x0) {
        Slice::Slice(&local_20,in_RDI->_builderPtr->_start + local_18);
        bVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::isString
                          ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                           0x11da4f);
        if (bVar1) {
          this_00 = (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                    in_RDI->options->attributeTranslator;
          in_stack_ffffffffffffffc8 =
               SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                         (this_00);
          key_00._M_str = (char *)in_RDI;
          key_00._M_len = in_stack_ffffffffffffffb0;
          start = AttributeTranslator::translate((AttributeTranslator *)this_00,key_00);
          if (start != (uint8_t *)0x0) {
            Builder::resetTo(in_stack_ffffffffffffff90,
                             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
            in_stack_ffffffffffffffa0 = in_RDI->_builderPtr;
            Slice::Slice((Slice *)&stack0xffffffffffffffc0,start);
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getUInt
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)in_RDI
                      );
            Builder::addUInt(in_stack_ffffffffffffff90,
                             CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
          }
        }
      }
      local_c = skipWhiteSpace((Parser *)in_stack_ffffffffffffffc8._M_len,
                               (char *)in_stack_ffffffffffffffc0._start);
      if (local_c != 0x3a) {
        uVar2 = __cxa_allocate_exception(0x18);
        Exception::Exception
                  ((Exception *)in_stack_ffffffffffffffa0,(ExceptionType)((ulong)uVar2 >> 0x20),
                   (char *)in_stack_ffffffffffffff90);
        __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
      }
      in_RDI->_pos = in_RDI->_pos + 1;
      parseJson((Parser *)in_stack_ffffffffffffffa0);
      iVar3 = 0x1330b4;
      local_c = skipWhiteSpace((Parser *)in_stack_ffffffffffffffc8._M_len,
                               (char *)in_stack_ffffffffffffffc0._start);
      EVar4 = (ExceptionType)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (local_c == 0x7d) break;
      if (local_c != 0x2c) {
        msg = (char *)__cxa_allocate_exception(0x18);
        Exception::Exception((Exception *)in_stack_ffffffffffffffa0,EVar4,msg);
        __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
      }
      in_RDI->_pos = in_RDI->_pos + 1;
      local_c = skipWhiteSpace((Parser *)in_stack_ffffffffffffffc8._M_len,
                               (char *)in_stack_ffffffffffffffc0._start);
    }
    in_RDI->_pos = in_RDI->_pos + 1;
    if ((in_RDI->_nesting != 1) || ((in_RDI->options->keepTopLevelOpen & 1U) == 0)) {
      Builder::close(in_RDI->_builderPtr,iVar3);
    }
    decreaseNesting(in_RDI);
  }
  return;
}

Assistant:

void Parser::parseObject() {
  _builderPtr->addObject();

  increaseNesting();
  int i = skipWhiteSpace("Expecting item or '}'");
  if (i == '}') {
    // empty object
    consume();  // the closing '}'. return value intentionally not checked

    if (_nesting != 0 || !options->keepTopLevelOpen) {
      // only close if we've not been asked to keep top level open
      decreaseNesting();
      _builderPtr->close();
    }
    return;
  }

  while (true) {
    // always expecting a string attribute name here
    if (VELOCYPACK_UNLIKELY(i != '"')) {
      throw Exception(Exception::ParseError, "Expecting '\"' or '}'");
    }
    // get past the initial '"'
    ++_pos;

    _builderPtr->reportAdd();
    auto const lastPos = _builderPtr->_pos;
    parseString();

    if (options->attributeTranslator != nullptr) {
      // check if a translation for the attribute name exists
      Slice key(_builderPtr->_start + lastPos);

      if (key.isString()) {
        uint8_t const* translated =
            options->attributeTranslator->translate(key.stringView());

        if (translated != nullptr) {
          // found translation... now reset position to old key position
          // and simply overwrite the existing key with the numeric translation
          // id
          _builderPtr->resetTo(lastPos);
          _builderPtr->addUInt(Slice(translated).getUInt());
        }
      }
    }

    i = skipWhiteSpace("Expecting ':'");
    // always expecting the ':' here
    if (VELOCYPACK_UNLIKELY(i != ':')) {
      throw Exception(Exception::ParseError, "Expecting ':'");
    }
    ++_pos;  // skip over the colon

    parseJson();

    i = skipWhiteSpace("Expecting ',' or '}'");
    if (i == '}') {
      // end of object
      ++_pos;  // the closing '}'
      if (_nesting != 1 || !options->keepTopLevelOpen) {
        // only close if we've not been asked to keep top level open
        _builderPtr->close();
      }
      decreaseNesting();
      return;
    }
    if (VELOCYPACK_UNLIKELY(i != ',')) {
      throw Exception(Exception::ParseError, "Expecting ',' or '}'");
    }
    // skip over ','
    ++_pos;  // the ','
    i = skipWhiteSpace("Expecting '\"' or '}'");
  }

  // should never get here
  VELOCYPACK_ASSERT(false);
}